

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O1

void greatest_usage(char *name)

{
  fprintf(_stdout,
          "Usage: %s [-hlfavex] [-s SUITE] [-t TEST] [-x EXCLUDE]\n  -h, --help  print this Help\n  -l          List suites and tests, then exit (dry run)\n  -f          Stop runner after first failure\n  -a          Abort on first failure (implies -f)\n  -v          Verbose output\n  -s SUITE    only run suites containing substring SUITE\n  -t TEST     only run tests containing substring TEST\n  -e          only run exact name match for -s or -t\n  -x EXCLUDE  exclude tests containing substring EXCLUDE\n"
          ,name);
  return;
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}